

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O3

bool __thiscall argvParser::foundAllRequierdArgs(argvParser *this)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar1;
  pointer ppsVar2;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  pvVar1 = (this->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar2 = (pvVar1->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(pvVar1->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2;
  if (lVar5 == 0) {
    bVar4 = true;
  }
  else {
    uVar6 = lVar5 >> 3;
    uVar7 = 0;
    bVar4 = false;
    do {
      pvVar3 = ppsVar2[uVar7]->arguments;
      lVar5 = *(long *)&(pvVar3->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data;
      lVar8 = (long)*(pointer *)
                     ((long)&(pvVar3->
                             super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                             )._M_impl.super__Vector_impl_data + 8) - lVar5;
      if (lVar8 != 0) {
        lVar8 = lVar8 >> 3;
        lVar9 = 0;
        do {
          if (*(char *)(*(long *)(lVar5 + lVar9 * 8) + 0xe8) != '\0') {
            return bVar4;
          }
          lVar9 = lVar9 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
      }
      uVar7 = uVar7 + 1;
      bVar4 = uVar6 <= uVar7;
    } while (uVar7 != uVar6 + (uVar6 == 0));
  }
  return bVar4;
}

Assistant:

bool argvParser::foundAllRequierdArgs() {
    for (int x = 0; x < newargconfig->size(); x++) {
        for(int y = 0; y<newargconfig->at(x)->arguments->size();y++){
            if (newargconfig->at(x)->arguments->at(y)->requiredAndNotHitJet)
                return false;
        }

    }
    return true;
}